

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

char * __thiscall util::fs::dirname(fs *this,char *__path)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  allocator local_3a;
  allocator local_39;
  ulong local_38;
  size_t len;
  allocator local_19;
  char *local_18;
  string *path_local;
  
  local_18 = __path;
  path_local = (string *)this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_38 = std::__cxx11::string::size();
    while( true ) {
      bVar3 = false;
      if (local_38 != 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
        bVar3 = *pcVar2 == '/';
      }
      if (!bVar3) break;
      local_38 = local_38 - 1;
    }
    if (local_38 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"/",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
    else {
      while( true ) {
        bVar3 = false;
        if (local_38 != 0) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
          bVar3 = *pcVar2 != '/';
        }
        if (!bVar3) break;
        local_38 = local_38 - 1;
      }
      if (local_38 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,".",&local_3a);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a);
      }
      else {
        while( true ) {
          bVar3 = false;
          if (1 < local_38) {
            pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_18);
            bVar3 = *pcVar2 == '/';
          }
          if (!bVar3) break;
          local_38 = local_38 - 1;
        }
        std::__cxx11::string::substr((ulong)this,(ulong)local_18);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,".",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  return (char *)this;
}

Assistant:

std::string
dirname (std::string const& path)
{
    if (path.empty())
        return ".";

    /* Skip group of slashes at the end. */
    std::size_t len = path.size();
    while (len > 0 && path[len - 1] == '/')
        len -= 1;
    if (len == 0)
        return "/";

    /* Skip basename. */
    while (len > 0 && path[len - 1] != '/')
        len -= 1;
    if (len == 0)
        return ".";

    /* Skip group of slashes. */
    while (len > 1 && path[len - 1] == '/')
        len -= 1;

    return path.substr(0, len);
}